

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

sz_sock sznet::net::sockets::sz_accept(sz_sock sockfd,sockaddr_in6 *addr)

{
  sockaddr *__addr;
  LogStream *this;
  SourceFile file;
  undefined1 local_1000 [12];
  Logger local_ff0;
  int local_20;
  socklen_t local_1c;
  sz_sock connfd;
  socklen_t addrlen;
  sockaddr_in6 *addr_local;
  sz_sock sockfd_local;
  
  local_1c = 0x1c;
  _connfd = addr;
  addr_local._4_4_ = sockfd;
  __addr = sz_sockaddr_cast(addr);
  local_20 = accept(sockfd,(sockaddr *)__addr,&local_1c);
  if (local_20 < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_1000,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1000._0_8_;
    file.m_size = local_1000._8_4_;
    Logger::Logger(&local_ff0,file,0x114,FATAL);
    this = Logger::stream(&local_ff0);
    LogStream::operator<<(this,"sockets::sz_accept");
    Logger::~Logger(&local_ff0);
  }
  else {
    sz_setnonblockandcloseonexec(local_20);
  }
  return local_20;
}

Assistant:

sz_sock sz_accept(sz_sock sockfd, struct sockaddr_in6* addr)
{
	socklen_t addrlen = static_cast<socklen_t>(sizeof *addr);
	sz_sock connfd = ::accept(sockfd, sz_sockaddr_cast(addr), &addrlen);
	if (connfd < 0)
	{
		LOG_FATAL << "sockets::sz_accept";
	}
	else
	{
		sz_setnonblockandcloseonexec(connfd);
	}

	return connfd;
}